

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::StringUtilTest_FindAndReplace_Test::TestBody
          (StringUtilTest_FindAndReplace_Test *this)

{
  string_view replace;
  string_view replace_00;
  string_view replace_01;
  string_view replace_02;
  string_view replace_03;
  string_view replace_04;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string_view find;
  string_view find_00;
  string_view find_01;
  string_view find_02;
  string_view find_03;
  string_view find_04;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_5;
  char *pcStack_2c0;
  basic_string_view<char,_std::char_traits<char>_> local_2b8;
  undefined1 local_2a8 [16];
  string local_298;
  AssertHelper local_278;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_4;
  char *pcStack_250;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  undefined1 local_238 [16];
  string local_228;
  AssertHelper local_208;
  Message local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_3;
  char *pcStack_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  undefined1 local_1c8 [16];
  string local_1b8;
  AssertHelper local_198;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  char *pcStack_170;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [16];
  string local_148;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  char *pcStack_100;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  undefined1 local_e8 [16];
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  char *pcStack_90;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  undefined1 local_78 [16];
  string local_68;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string tester;
  StringUtilTest_FindAndReplace_Test *this_local;
  
  tester.field_2._8_8_ = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"hoobla derp hoobla derp porkrind",&local_31);
  ::std::allocator<char>::~allocator(&local_31);
  local_78 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"blah");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"woof");
  replace._M_str = pcStack_90;
  replace._M_len =
       (size_t)gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  find._M_str = in_R9;
  find._M_len = (size_t)local_88._M_str;
  str._M_str = (char *)local_88._M_len;
  str._M_len = local_78._8_8_;
  string_util::FindAndReplace_abi_cxx11_(&local_68,(string_util *)local_78._0_8_,str,find,replace);
  ::std::__cxx11::string::operator=((string *)local_30,(string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_68);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[33],_nullptr>
            ((EqHelper *)local_a8,"tester","\"hoobla derp hoobla derp porkrind\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [33])"hoobla derp hoobla derp porkrind");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_e8 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_1.message_,"yeet");
  replace_00._M_str = pcStack_100;
  replace_00._M_len =
       (size_t)gtest_ar_1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  find_00._M_str = in_R9;
  find_00._M_len = (size_t)local_f8._M_str;
  str_00._M_str = (char *)local_f8._M_len;
  str_00._M_len = local_e8._8_8_;
  string_util::FindAndReplace_abi_cxx11_
            (&local_d8,(string_util *)local_e8._0_8_,str_00,find_00,replace_00);
  ::std::__cxx11::string::operator=((string *)local_30,(string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[33],_nullptr>
            ((EqHelper *)local_118,"tester","\"hoobla derp hoobla derp porkrind\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [33])"hoobla derp hoobla derp porkrind");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_158 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_168,"hoobla");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_2.message_,"derp");
  replace_01._M_str = pcStack_170;
  replace_01._M_len =
       (size_t)gtest_ar_2.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  find_01._M_str = in_R9;
  find_01._M_len = (size_t)local_168._M_str;
  str_01._M_str = (char *)local_168._M_len;
  str_01._M_len = local_158._8_8_;
  string_util::FindAndReplace_abi_cxx11_
            (&local_148,(string_util *)local_158._0_8_,str_01,find_01,replace_01);
  ::std::__cxx11::string::operator=((string *)local_30,(string *)&local_148);
  ::std::__cxx11::string::~string((string *)&local_148);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[29],_nullptr>
            ((EqHelper *)local_188,"tester","\"derp derp derp derp porkrind\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [29])"derp derp derp derp porkrind");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1c8 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"derp");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_3.message_,"a");
  replace_02._M_str = pcStack_1e0;
  replace_02._M_len =
       (size_t)gtest_ar_3.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  find_02._M_str = in_R9;
  find_02._M_len = (size_t)local_1d8._M_str;
  str_02._M_str = (char *)local_1d8._M_len;
  str_02._M_len = local_1c8._8_8_;
  string_util::FindAndReplace_abi_cxx11_
            (&local_1b8,(string_util *)local_1c8._0_8_,str_02,find_02,replace_02);
  ::std::__cxx11::string::operator=((string *)local_30,(string *)&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[17],_nullptr>
            ((EqHelper *)local_1f8,"tester","\"a a a a porkrind\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [17])"a a a a porkrind");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_238 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"a ");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_4.message_,"");
  replace_03._M_str = pcStack_250;
  replace_03._M_len =
       (size_t)gtest_ar_4.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  find_03._M_str = in_R9;
  find_03._M_len = (size_t)local_248._M_str;
  str_03._M_str = (char *)local_248._M_len;
  str_03._M_len = local_238._8_8_;
  string_util::FindAndReplace_abi_cxx11_
            (&local_228,(string_util *)local_238._0_8_,str_03,find_03,replace_03);
  ::std::__cxx11::string::operator=((string *)local_30,(string *)&local_228);
  ::std::__cxx11::string::~string((string *)&local_228);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_268,"tester","\"porkrind\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [9])0x71cc0f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  local_2a8 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b8,"porkrind");
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_5.message_,"");
  replace_04._M_str = pcStack_2c0;
  replace_04._M_len =
       (size_t)gtest_ar_5.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  find_04._M_str = in_R9;
  find_04._M_len = (size_t)local_2b8._M_str;
  str_04._M_str = (char *)local_2b8._M_len;
  str_04._M_len = local_2a8._8_8_;
  string_util::FindAndReplace_abi_cxx11_
            (&local_298,(string_util *)local_2a8._0_8_,str_04,find_04,replace_04);
  ::std::__cxx11::string::operator=((string *)local_30,(string *)&local_298);
  ::std::__cxx11::string::~string((string *)&local_298);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_2d8,"tester","\"\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [1])"");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  ::std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(StringUtilTest, FindAndReplace) {
  std::string tester = "hoobla derp hoobla derp porkrind";
  tester = bssl::string_util::FindAndReplace(tester, "blah", "woof");
  EXPECT_EQ(tester, "hoobla derp hoobla derp porkrind");
  tester = bssl::string_util::FindAndReplace(tester, "", "yeet");
  EXPECT_EQ(tester, "hoobla derp hoobla derp porkrind");
  tester = bssl::string_util::FindAndReplace(tester, "hoobla", "derp");
  EXPECT_EQ(tester, "derp derp derp derp porkrind");
  tester = bssl::string_util::FindAndReplace(tester, "derp", "a");
  EXPECT_EQ(tester, "a a a a porkrind");
  tester = bssl::string_util::FindAndReplace(tester, "a ", "");
  EXPECT_EQ(tester, "porkrind");
  tester = bssl::string_util::FindAndReplace(tester, "porkrind", "");
  EXPECT_EQ(tester, "");
}